

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.hpp
# Opt level: O3

void __thiscall
PseudoTopoOrder::PseudoTopoOrder
          (PseudoTopoOrder *this,DiGraph *m,vector<int,_std::allocator<int>_> *ts,
          vector<int,_std::allocator<int>_> *tsi)

{
  rep rVar1;
  allocator_type local_32;
  allocator_type local_31;
  value_type_conflict local_30 [2];
  
  std::vector<int,_std::allocator<int>_>::vector(&this->pto,ts);
  std::vector<int,_std::allocator<int>_>::vector(&this->pto_inverse,tsi);
  local_30[1] = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->dynamic_programming,
             (long)(ts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,local_30 + 1,&local_31);
  local_30[0] = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&this->best_parent,
             (long)(ts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(ts->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2,local_30,&local_32);
  this->best_index = 0;
  this->first_unknown = 0;
  this->path_filled = false;
  (this->m_path).super__Vector_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_path).super__Vector_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_path).super__Vector_base<NeighborNode,_std::allocator<NeighborNode>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_parent = m;
  this->global_best = 0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->timer).m_timer.__d.__r = rVar1;
  return;
}

Assistant:

PseudoTopoOrder(const DiGraph& m, const std::vector<node_t>& ts, const std::vector<node_t>& tsi) :
		pto(ts),
		pto_inverse(tsi),
		dynamic_programming(ts.size(), 0),
		best_parent(ts.size(),-1),
		best_index(0),
		first_unknown(0),
		path_filled(false),
		m_path(),
		m_parent(m) {}